

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::AlignFirstTextHeightToWidgets(void)

{
  float text_offset_y;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImVec2 local_8;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems == false) {
    text_offset_y = (pIVar2->Style).FramePadding.y;
    local_8 = (ImVec2)((ulong)(uint)(text_offset_y + text_offset_y + pIVar2->FontSize) << 0x20);
    ItemSize(&local_8,text_offset_y);
    pIVar1 = GImGui->CurrentWindow;
    pIVar1->Accessed = true;
    if (pIVar1->SkipItems == false) {
      (pIVar1->DC).CursorPos.x = (pIVar1->DC).CursorPosPrevLine.x + 0.0;
      (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
      (pIVar1->DC).CurrentLineHeight = (pIVar1->DC).PrevLineHeight;
      (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
    }
  }
  return;
}

Assistant:

void ImGui::AlignFirstTextHeightToWidgets()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    // Declare a dummy item size to that upcoming items that are smaller will center-align on the newly expanded line height.
    ImGuiContext& g = *GImGui;
    ItemSize(ImVec2(0, g.FontSize + g.Style.FramePadding.y*2), g.Style.FramePadding.y);
    SameLine(0, 0);
}